

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lundump.cpp
# Opt level: O0

Proto * LoadFunction(LoadState *S,TString *p)

{
  StkId pTVar1;
  ushort uVar2;
  int iVar3;
  GCObject *f_00;
  TString *pTVar4;
  TValue *i_o;
  Proto *f;
  TString *p_local;
  LoadState *S_local;
  
  uVar2 = S->L->nCcalls + 1;
  S->L->nCcalls = uVar2;
  if (200 < uVar2) {
    error(S,"code too deep");
  }
  f_00 = (GCObject *)luaF_newproto(S->L);
  pTVar1 = S->L->top;
  (pTVar1->value).gc = f_00;
  pTVar1->tt = 9;
  if ((long)S->L->stack_last - (long)S->L->top < 0x11) {
    luaD_growstack(S->L,1);
  }
  S->L->top = S->L->top + 1;
  pTVar4 = LoadString(S);
  (f_00->p).source = pTVar4;
  if ((f_00->p).source == (TString *)0x0) {
    (f_00->p).source = p;
  }
  iVar3 = LoadInt(S);
  (f_00->p).linedefined = iVar3;
  iVar3 = LoadInt(S);
  (f_00->p).lastlinedefined = iVar3;
  iVar3 = LoadChar(S);
  (f_00->p).nups = (lu_byte)iVar3;
  iVar3 = LoadChar(S);
  (f_00->p).numparams = (lu_byte)iVar3;
  iVar3 = LoadChar(S);
  (f_00->p).is_vararg = (lu_byte)iVar3;
  iVar3 = LoadChar(S);
  (f_00->p).maxstacksize = (lu_byte)iVar3;
  LoadCode(S,&f_00->p);
  LoadConstants(S,&f_00->p);
  LoadDebug(S,&f_00->p);
  iVar3 = luaG_checkcode(&f_00->p);
  if (iVar3 == 0) {
    error(S,"bad code");
  }
  S->L->top = S->L->top + -1;
  S->L->nCcalls = S->L->nCcalls - 1;
  return (Proto *)f_00;
}

Assistant:

static Proto* LoadFunction(LoadState* S, TString* p)
{
 Proto* f;
 if (++S->L->nCcalls > LUAI_MAXCCALLS) error(S,"code too deep");
 f=luaF_newproto(S->L);
 setptvalue2s(S->L,S->L->top,f); incr_top(S->L);
 f->source=LoadString(S); if (f->source==NULL) f->source=p;
 f->linedefined=LoadInt(S);
 f->lastlinedefined=LoadInt(S);
 f->nups=LoadByte(S);
 f->numparams=LoadByte(S);
 f->is_vararg=LoadByte(S);
 f->maxstacksize=LoadByte(S);
 LoadCode(S,f);
 LoadConstants(S,f);
 LoadDebug(S,f);
 IF (!luaG_checkcode(f), "bad code");
 S->L->top--;
 S->L->nCcalls--;
 return f;
}